

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall
ON_MeshNgon::GetBoundarySides
          (ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list,
          ON_SimpleArray<unsigned_int> *ngon_boundary_sides)

{
  uint face_index_count;
  uint *face_index_list;
  undefined8 vertex_face_map_00;
  uint uVar1;
  uint uVar2;
  NgonNeighbors *pNVar3;
  int local_78;
  uint segment_count;
  undefined1 local_68 [8];
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  uint **vertex_face_map;
  uint mesh_vertex_count;
  uint *ngon_fi;
  uint ngon_fi_count;
  uint boundary_edge_count;
  uint ngon_boundary_segment_count;
  ON_SimpleArray<unsigned_int> *ngon_boundary_sides_local;
  ON_MeshFaceList *mesh_face_list_local;
  ON_MeshNgon *this_local;
  
  ngon_fi_count = 0;
  ON_SimpleArray<unsigned_int>::SetCount(ngon_boundary_sides,0);
  face_index_count = this->m_Fcount;
  face_index_list = this->m_fi;
  if ((face_index_count != 0) && (face_index_list != (uint *)0x0)) {
    ngon_nbr_map.m_count = 0;
    ngon_nbr_map.m_capacity = 0;
    ON_SimpleArray<NgonNeighbors>::ON_SimpleArray((ON_SimpleArray<NgonNeighbors> *)local_68);
    ON_SimpleArray<NgonNeighbors>::Reserve
              ((ON_SimpleArray<NgonNeighbors> *)local_68,(ulong)face_index_count);
    ON_SimpleArray<NgonNeighbors>::SetCount
              ((ON_SimpleArray<NgonNeighbors> *)local_68,face_index_count);
    vertex_face_map_00 = ngon_nbr_map._16_8_;
    pNVar3 = ON_SimpleArray<NgonNeighbors>::Array((ON_SimpleArray<NgonNeighbors> *)local_68);
    uVar1 = SetFaceNeighborMap(0xfffffffe,mesh_face_list,(uint **)vertex_face_map_00,
                               (ON_MeshVertexFaceMap *)0x0,face_index_count,face_index_list,pNVar3);
    if (uVar1 == 0) {
      local_78 = 2;
    }
    else {
      ON_SimpleArray<unsigned_int>::SetCount(ngon_boundary_sides,0);
      ON_SimpleArray<unsigned_int>::Reserve(ngon_boundary_sides,(ulong)uVar1);
      do {
        pNVar3 = ON_SimpleArray<NgonNeighbors>::Array((ON_SimpleArray<NgonNeighbors> *)local_68);
        uVar2 = GetNgonBoundarySegments
                          (mesh_face_list,face_index_count,face_index_list,ngon_fi_count,pNVar3,
                           (ON_SimpleArray<unsigned_int> *)0x0,ngon_boundary_sides);
        if (uVar2 == 0) {
          local_78 = 2;
          goto LAB_0075511d;
        }
        ngon_fi_count = uVar2 + ngon_fi_count;
      } while (ngon_fi_count < uVar1);
      this_local._4_4_ = ON_SimpleArray<unsigned_int>::UnsignedCount(ngon_boundary_sides);
      local_78 = 1;
    }
LAB_0075511d:
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray((ON_SimpleArray<NgonNeighbors> *)local_68);
    if (local_78 == 1) {
      return this_local._4_4_;
    }
  }
  ON_SimpleArray<unsigned_int>::SetCount(ngon_boundary_sides,0);
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::GetBoundarySides(
  const class ON_MeshFaceList& mesh_face_list,
  ON_SimpleArray<unsigned int>& ngon_boundary_sides
  ) const
{
  unsigned int ngon_boundary_segment_count = 0;
  unsigned int boundary_edge_count;

  ngon_boundary_sides.SetCount(0);


  for(;;)
  {
    const unsigned int ngon_fi_count(m_Fcount);
    const unsigned int* ngon_fi(m_fi);
    if ( ngon_fi_count <= 0 || 0 == ngon_fi )
      break;

    const unsigned int mesh_vertex_count = 0xFFFFFFFE;
    const unsigned int *const* vertex_face_map = 0;

    ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
    ngon_nbr_map.Reserve(ngon_fi_count);
    ngon_nbr_map.SetCount(ngon_fi_count);
    boundary_edge_count = SetFaceNeighborMap(
      mesh_vertex_count,
      mesh_face_list,
      vertex_face_map,
      nullptr,
      ngon_fi_count,
      ngon_fi,
      ngon_nbr_map.Array()
      );

    if ( boundary_edge_count <= 0 )
      break;

    ngon_boundary_sides.SetCount(0);
    ngon_boundary_sides.Reserve(boundary_edge_count);

    for(;;)
    {
      // keep adding boundary components until we
      // find all of them or there is an error
      unsigned int segment_count =  GetNgonBoundarySegments(
        mesh_face_list,
        (unsigned int)ngon_fi_count,
        ngon_fi,
        ngon_boundary_segment_count,
        ngon_nbr_map.Array(),
        0,
        &ngon_boundary_sides
        );
      if ( segment_count <= 0 )
        break; //error

      ngon_boundary_segment_count += segment_count;
      if ( ngon_boundary_segment_count >= boundary_edge_count )
        return ngon_boundary_sides.UnsignedCount(); // found them all
    }

    break; // error if we get here
  }

  // failure
  ngon_boundary_sides.SetCount(0);

  return 0;
}